

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall
QCommonListViewBase::updateHorizontalScrollBar(QCommonListViewBase *this,QSize *step)

{
  int iVar1;
  QWidgetData *pQVar2;
  QWidget *this_00;
  ScrollBarPolicy SVar3;
  QScrollBar *pQVar4;
  int max;
  int iVar5;
  bool bVar6;
  QRect QVar7;
  QMargins QVar8;
  
  pQVar4 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this->qq);
  QAbstractSliderPrivate::itemviewChangeSingleStep
            (*(QAbstractSliderPrivate **)&(pQVar4->super_QAbstractSlider).super_QWidget.field_0x8,
             this->dd->space + (step->wd).m_i);
  pQVar4 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this->qq);
  pQVar2 = ((this->dd->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
           data;
  QAbstractSlider::setPageStep
            (&pQVar4->super_QAbstractSlider,((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1);
  SVar3 = QAbstractScrollArea::verticalScrollBarPolicy((QAbstractScrollArea *)this->qq);
  bVar6 = true;
  if (SVar3 == ScrollBarAsNeeded) {
    SVar3 = QAbstractScrollArea::horizontalScrollBarPolicy((QAbstractScrollArea *)this->qq);
    bVar6 = SVar3 != ScrollBarAsNeeded;
  }
  this_00 = (QWidget *)this->qq;
  QVar7 = QWidget::contentsRect(this_00);
  QVar8 = QAbstractScrollArea::viewportMargins((QAbstractScrollArea *)this_00);
  iVar5 = (QVar7.x2.m_i.m_i - (QVar8.m_right.m_i.m_i + QVar8.m_left.m_i.m_i + QVar7.x1.m_i.m_i)) + 1
  ;
  iVar1 = (this->contentsSize).wd.m_i;
  if ((QVar7.y2.m_i.m_i - (QVar8.m_bottom.m_i.m_i + QVar8.m_top.m_i.m_i + QVar7.y1.m_i.m_i)) + 1 <
      (this->contentsSize).ht.m_i) {
    pQVar4 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->qq);
    pQVar2 = (pQVar4->super_QAbstractSlider).super_QWidget.data;
    iVar5 = ~(pQVar2->crect).x2.m_i + iVar5 + (pQVar2->crect).x1.m_i;
  }
  pQVar4 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this->qq);
  max = 0;
  if ((bool)(bVar6 | iVar5 < iVar1)) {
    pQVar2 = ((this->dd->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)
             ->data;
    max = ~(pQVar2->crect).x2.m_i + (this->contentsSize).wd.m_i + (pQVar2->crect).x1.m_i;
  }
  QAbstractSlider::setRange(&pQVar4->super_QAbstractSlider,0,max);
  return;
}

Assistant:

void QCommonListViewBase::updateHorizontalScrollBar(const QSize &step)
{
    horizontalScrollBar()->d_func()->itemviewChangeSingleStep(step.width() + spacing());
    horizontalScrollBar()->setPageStep(viewport()->width());

    // If both scroll bars are set to auto, we might end up in a situation with enough space
    // for the actual content. But still one of the scroll bars will become enabled due to
    // the other one using the space. The other one will become invisible in the same cycle.
    // -> Infinite loop, QTBUG-39902
    const bool bothScrollBarsAuto = qq->verticalScrollBarPolicy() == Qt::ScrollBarAsNeeded &&
                                    qq->horizontalScrollBarPolicy() == Qt::ScrollBarAsNeeded;

    const QSize viewportSize = QListModeViewBase::viewportSize(qq);

    bool verticalWantsToShow = contentsSize.height() > viewportSize.height();
    bool horizontalWantsToShow;
    if (verticalWantsToShow)
        horizontalWantsToShow = contentsSize.width() > viewportSize.width() - qq->verticalScrollBar()->width();
    else
        horizontalWantsToShow = contentsSize.width() > viewportSize.width();

    if (bothScrollBarsAuto && !horizontalWantsToShow) {
        // break the infinite loop described above by setting the range to 0, 0.
        // QAbstractScrollArea will then hide the scroll bar for us
        horizontalScrollBar()->setRange(0, 0);
    } else {
        horizontalScrollBar()->setRange(0, contentsSize.width() - viewport()->width());
    }
}